

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O2

void __thiscall
asio::detail::
recycling_allocator<asio::detail::reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
::deallocate(recycling_allocator<asio::detail::reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
             *this,reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
                   *p,size_t n)

{
  undefined8 uVar1;
  long *in_FS_OFFSET;
  
  if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
  }
  thread_info_base::deallocate<asio::detail::thread_info_base::default_tag>(uVar1,p,n * 0xb8);
  return;
}

Assistant:

void deallocate(T* p, std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    thread_info_base::deallocate(Purpose(),
        thread_context::top_of_thread_call_stack(), p, sizeof(T) * n);
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    (void)n;
    asio::aligned_delete(p);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  }